

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O0

void __thiscall capnp::compiler::ModuleLoader::ModuleImpl::~ModuleImpl(ModuleImpl *this)

{
  ModuleImpl *this_local;
  
  kj::Vector<capnp::compiler::Resolution>::~Vector(&this->resolutions);
  kj::Maybe<kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>_>::~Maybe(&this->lineBreaks);
  kj::SpaceFor<capnp::compiler::LineBreakTable>::~SpaceFor(&this->lineBreaksSpace);
  kj::String::~String(&this->sourceNameStr);
  kj::Path::~Path(&this->path);
  kj::Own<const_kj::ReadableFile,_std::nullptr_t>::~Own(&this->file);
  return;
}

Assistant:

ModuleImpl(ModuleLoader::Impl& loader, kj::Own<const kj::ReadableFile> file,
             const kj::ReadableDirectory& sourceDir, kj::Path pathParam)
      : loader(loader), file(kj::mv(file)), sourceDir(sourceDir), path(kj::mv(pathParam)),
        sourceNameStr(path.toString()) {
    KJ_REQUIRE(path.size() > 0);
  }